

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext_p.h
# Opt level: O0

void __thiscall
asmjit::v1_14::FuncArgsContext::WorkData::swap
          (WorkData *this,uint32_t aVarId,uint32_t aRegId,uint32_t bVarId,uint32_t bRegId)

{
  bool bVar1;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  WorkData *in_RDI;
  uint in_R8D;
  char *in_stack_000003d0;
  int in_stack_000003dc;
  char *in_stack_000003e0;
  uint32_t in_stack_ffffffffffffffdc;
  
  bVar1 = isAssigned(in_RDI,in_stack_ffffffffffffffdc);
  if (!bVar1) {
    DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
  }
  bVar1 = isAssigned(in_RDI,in_stack_ffffffffffffffdc);
  if (!bVar1) {
    DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
  }
  if (in_RDI->_physToVarId[in_EDX] != in_ESI) {
    DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
  }
  if (in_RDI->_physToVarId[in_R8D] != in_ECX) {
    DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
  }
  in_RDI->_physToVarId[in_EDX] = (uint8_t)in_ECX;
  in_RDI->_physToVarId[in_R8D] = (uint8_t)in_ESI;
  return;
}

Assistant:

inline void swap(uint32_t aVarId, uint32_t aRegId, uint32_t bVarId, uint32_t bRegId) noexcept {
      ASMJIT_ASSERT(isAssigned(aRegId));
      ASMJIT_ASSERT(isAssigned(bRegId));
      ASMJIT_ASSERT(_physToVarId[aRegId] == aVarId);
      ASMJIT_ASSERT(_physToVarId[bRegId] == bVarId);

      _physToVarId[aRegId] = uint8_t(bVarId);
      _physToVarId[bRegId] = uint8_t(aVarId);
    }